

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_refinement.cpp
# Opt level: O2

void __thiscall duckdb::CSVSniffer::RefineTypes(CSVSniffer *this)

{
  size_type __n;
  pointer pLVar1;
  pointer pLVar2;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pointer pSVar8;
  CSVStateMachine *pCVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  undefined4 extraout_var;
  DataChunk *this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_01;
  reference parse_chunk_col;
  ulong uVar12;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *this_02;
  ulong local_90;
  vector<duckdb::LogicalType,_true> *local_88;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *local_80;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_78;
  LogicalType d_type;
  LogicalType local_58;
  ulong local_40;
  CSVStateMachine *local_38;
  
  local_80 = &this->best_candidate;
  pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(local_80);
  pCVar9 = BaseScanner::GetStateMachine(&pSVar8->super_BaseScanner);
  __n = (pCVar9->dialect_options).num_cols;
  LogicalType::LogicalType(&d_type,VARCHAR);
  local_88 = &this->detected_types;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_fill_assign
            (&(this->detected_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__n,&d_type);
  LogicalType::~LogicalType(&d_type);
  if (pCVar9->options->all_varchar == false) {
    local_78 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->best_sql_types_candidates_per_column_idx;
    uVar12 = 1;
    this_02 = local_80;
    local_38 = pCVar9;
    do {
      if (pCVar9->options->sample_size_chunks <= uVar12) {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
                  (&local_88->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        for (local_90 = 0; p_Var3 = local_78,
            local_90 < (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count;
            local_90 = local_90 + 1) {
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_78,&local_90);
          pvVar11 = vector<duckdb::LogicalType,_true>::back(pmVar10);
          LogicalType::LogicalType(&d_type,pvVar11);
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](p_Var3,&local_90);
          pLVar1 = (pmVar10->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pLVar2 = (pmVar10->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                   ::operator->(local_80);
          pCVar9 = BaseScanner::GetStateMachine(&pSVar8->super_BaseScanner);
          if (((long)pLVar1 - (long)pLVar2 ==
               (long)(pCVar9->options->auto_type_candidates).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pCVar9->options->auto_type_candidates).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) &&
             (this->default_null_to_varchar == true)) {
            LogicalType::LogicalType(&local_58,VARCHAR);
            LogicalType::operator=(&d_type,&local_58);
            LogicalType::~LogicalType(&local_58);
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&local_88->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     &d_type);
          LogicalType::~LogicalType(&d_type);
        }
        return;
      }
      local_40 = uVar12;
      pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
               ::operator->(this_02);
      bVar4 = BaseScanner::FinishedFile(&pSVar8->super_BaseScanner);
      if (bVar4) {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
                  (&local_88->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        for (local_90 = 0; p_Var3 = local_78,
            local_90 < (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count;
            local_90 = local_90 + 1) {
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_78,&local_90);
          pvVar11 = vector<duckdb::LogicalType,_true>::back(pmVar10);
          LogicalType::LogicalType(&d_type,pvVar11);
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](p_Var3,&local_90);
          if ((long)(pmVar10->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pmVar10->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
              (long)(pCVar9->options->auto_type_candidates).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar9->options->auto_type_candidates).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
            LogicalType::LogicalType(&local_58,VARCHAR);
            LogicalType::operator=(&d_type,&local_58);
            LogicalType::~LogicalType(&local_58);
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&local_88->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     &d_type);
          LogicalType::~LogicalType(&d_type);
        }
      }
      else {
        pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                 ::operator->(this_02);
        iVar7 = (*(pSVar8->super_BaseScanner)._vptr_BaseScanner[2])(pSVar8);
        this_00 = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar7));
        local_58._0_8_ = 0;
LAB_009805db:
        if ((ulong)local_58._0_8_ <
            (ulong)(((long)(this_00->data).
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x68)) {
          this_01 = &::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_78,(key_type *)&local_58)->
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
          pvVar11 = vector<duckdb::LogicalType,_true>::back
                              ((vector<duckdb::LogicalType,_true> *)this_01);
          LogicalType::LogicalType(&d_type,BOOLEAN);
          bVar5 = LogicalType::operator==(pvVar11,&d_type);
          LogicalType::~LogicalType(&d_type);
          while (1 < (ulong)(((long)(this_01->
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   )._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
            pvVar11 = vector<duckdb::LogicalType,_true>::back
                                ((vector<duckdb::LogicalType,_true> *)this_01);
            parse_chunk_col = vector<duckdb::Vector,_true>::get<true>(&this_00->data,local_58._0_8_)
            ;
            bVar6 = TryCastVector(this,parse_chunk_col,this_00->count,pvVar11);
            if (bVar6) break;
            pvVar11 = vector<duckdb::LogicalType,_true>::back
                                ((vector<duckdb::LogicalType,_true> *)this_01);
            LogicalType::LogicalType(&d_type,BOOLEAN);
            bVar6 = LogicalType::operator==(pvVar11,&d_type);
            LogicalType::~LogicalType(&d_type);
            if (bVar6 && bVar5) goto LAB_009806c6;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::pop_back
                      (this_01);
          }
          goto LAB_009806f6;
        }
        DataChunk::Reset(this_00);
        this_00->capacity = 0x800;
        this_02 = local_80;
      }
      uVar12 = local_40 + 1;
    } while (!bVar4);
  }
  return;
LAB_009806c6:
  while( true ) {
    pvVar11 = vector<duckdb::LogicalType,_true>::back((vector<duckdb::LogicalType,_true> *)this_01);
    LogicalType::LogicalType(&d_type,VARCHAR);
    bVar5 = LogicalType::operator!=(pvVar11,&d_type);
    LogicalType::~LogicalType(&d_type);
    if (!bVar5) break;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::pop_back(this_01);
  }
LAB_009806f6:
  local_58._0_8_ = local_58._0_8_ + 1;
  pCVar9 = local_38;
  goto LAB_009805db;
}

Assistant:

void CSVSniffer::RefineTypes() {
	auto &sniffing_state_machine = best_candidate->GetStateMachine();
	// if data types were provided, exit here if number of columns does not match
	detected_types.assign(sniffing_state_machine.dialect_options.num_cols, LogicalType::VARCHAR);
	if (sniffing_state_machine.options.all_varchar) {
		// return all types varchar
		return;
	}
	for (idx_t i = 1; i < sniffing_state_machine.options.sample_size_chunks; i++) {
		bool finished_file = best_candidate->FinishedFile();
		if (finished_file) {
			// we finished the file: stop
			// set sql types
			detected_types.clear();
			for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
				LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
				if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
				    sniffing_state_machine.options.auto_type_candidates.size()) {
					d_type = LogicalType::VARCHAR;
				}
				detected_types.push_back(d_type);
			}
			return;
		}
		auto &parse_chunk = best_candidate->ParseChunk().ToChunk();

		for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
			vector<LogicalType> &col_type_candidates = best_sql_types_candidates_per_column_idx[col];
			bool is_bool_type = col_type_candidates.back() == LogicalType::BOOLEAN;
			while (col_type_candidates.size() > 1) {
				const auto &sql_type = col_type_candidates.back();
				if (TryCastVector(parse_chunk.data[col], parse_chunk.size(), sql_type)) {
					break;
				}
				if (col_type_candidates.back() == LogicalType::BOOLEAN && is_bool_type) {
					// If we thought this was a boolean value (i.e., T,F, True, False) and it is not, we
					// immediately pop to varchar.
					while (col_type_candidates.back() != LogicalType::VARCHAR) {
						col_type_candidates.pop_back();
					}
					break;
				}
				col_type_candidates.pop_back();
			}
		}
		// reset parse chunk for the next iteration
		parse_chunk.Reset();
		parse_chunk.SetCapacity(CSVReaderOptions::sniff_size);
	}
	detected_types.clear();
	// set sql types
	for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
		LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
		if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
		        best_candidate->GetStateMachine().options.auto_type_candidates.size() &&
		    default_null_to_varchar) {
			d_type = LogicalType::VARCHAR;
		}
		detected_types.push_back(d_type);
	}
}